

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O2

void __thiscall
icu_63::anon_unknown_0::AllSameBlocks::add
          (AllSameBlocks *this,int32_t index,int32_t count,uint32_t value)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)this->length;
  if (this->length < 1) {
    uVar2 = uVar3;
  }
  iVar4 = 0x11000;
  uVar5 = 0xffffffffffffffff;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    iVar1 = this->refCounts[uVar3];
    if (iVar1 < iVar4) {
      uVar5 = uVar3;
    }
    uVar5 = uVar5 & 0xffffffff;
    if (iVar1 < iVar4) {
      iVar4 = iVar1;
    }
  }
  iVar4 = (int)uVar5;
  this->mostRecent = iVar4;
  this->indexes[iVar4] = index;
  this->values[iVar4] = value;
  this->refCounts[iVar4] = count;
  return;
}

Assistant:

void add(int32_t index, int32_t count, uint32_t value) {
        U_ASSERT(length == CAPACITY);
        int32_t least = -1;
        int32_t leastCount = I_LIMIT;
        for (int32_t i = 0; i < length; ++i) {
            U_ASSERT(values[i] != value);
            if (refCounts[i] < leastCount) {
                least = i;
                leastCount = refCounts[i];
            }
        }
        U_ASSERT(least >= 0);
        mostRecent = least;
        indexes[least] = index;
        values[least] = value;
        refCounts[least] = count;
    }